

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_CommandLineArguments_setCompleteExcludeStrictGroupDotNameFilter_TestShell::createTest
          (TEST_CommandLineArguments_setCompleteExcludeStrictGroupDotNameFilter_TestShell *this)

{
  TEST_CommandLineArguments_setCompleteExcludeStrictGroupDotNameFilter_Test *this_00;
  TEST_CommandLineArguments_setCompleteExcludeStrictGroupDotNameFilter_TestShell *this_local;
  
  this_00 = (TEST_CommandLineArguments_setCompleteExcludeStrictGroupDotNameFilter_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                         ,0x10a);
  TEST_CommandLineArguments_setCompleteExcludeStrictGroupDotNameFilter_Test::
  TEST_CommandLineArguments_setCompleteExcludeStrictGroupDotNameFilter_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(CommandLineArguments, setCompleteExcludeStrictGroupDotNameFilter)
{
    int argc = 3;
    const char* argv[] = { "tests.exe", "-xst", "group.name" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter groupFilter("group");
    groupFilter.strictMatching();
    groupFilter.invertMatching();
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
    TestFilter nameFilter("name");
    nameFilter.strictMatching();
    nameFilter.invertMatching();
    CHECK_EQUAL(nameFilter, *args->getNameFilters());
}